

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_scan_qtree_single
          (bsc_step_t depends,bsc_group_t group,void *src,void *dst,void *tmp_space,
          bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size,int q)

{
  bsp_pid_t bVar1;
  int iVar2;
  int iVar3;
  bsp_pid_t bVar4;
  void *pvVar5;
  void *pvVar6;
  request_t *prVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  bsc_step_t local_94;
  void *local_60;
  
  if (group == (bsc_group_t)0x0) {
    iVar2 = bsp_nprocs();
    iVar3 = bsp_pid();
  }
  else {
    iVar2 = *group;
    lVar11 = *(long *)((long)group + 8);
    bVar1 = bsp_pid();
    iVar3 = *(int *)(lVar11 + (long)bVar1 * 4);
  }
  (*reducer)(dst,zero,src,size * nmemb);
  local_94 = depends;
  if (1 < iVar2) {
    pvVar5 = (void *)((long)(iVar2 * size) + (long)tmp_space);
    pvVar6 = (void *)((long)((nmemb + -1) * size) + (long)dst);
    if (nmemb == 0) {
      pvVar6 = zero;
    }
    iVar12 = 1;
    iVar10 = 0;
    do {
      local_60 = pvVar6;
      if ((iVar12 != 1) &&
         (local_60 = (void *)((long)((iVar10 + -1) * size) + (long)pvVar5), iVar10 == 0)) {
        local_60 = zero;
      }
      uVar8 = (uint)(iVar12 == 1);
      if (1 < q) {
        iVar9 = iVar3 + iVar12 + uVar8;
        lVar11 = (ulong)(uint)q - 1;
        iVar10 = size;
        do {
          if (iVar9 < iVar2) {
            bVar1 = iVar9;
            if (group != (bsc_group_t)0x0) {
              bVar1 = *(bsp_pid_t *)(*(long *)((long)group + 0x10) + (long)iVar9 * 4);
            }
            bVar4 = bsp_pid();
            prVar7 = new_request(local_94);
            prVar7->kind = PUT;
            (prVar7->payload).put.src_addr = local_60;
            (prVar7->payload).put.dst_addr = tmp_space;
            (prVar7->payload).put.src_pid = bVar4;
            (prVar7->payload).put.dst_pid = bVar1;
            (prVar7->payload).put.size = size;
            (prVar7->payload).put.offset = iVar10;
          }
          iVar10 = iVar10 + size;
          iVar9 = iVar9 + iVar12;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      iVar10 = (int)((iVar12 - uVar8) + iVar3) / iVar12;
      if (q <= iVar10) {
        iVar10 = q;
      }
      if (iVar3 < (int)(iVar2 - uVar8)) {
        if (group == (bsc_group_t)0x0) {
          bVar1 = uVar8 + iVar3;
        }
        else {
          bVar1 = *(bsp_pid_t *)(*(long *)((long)group + 0x10) + (long)(int)(uVar8 + iVar3) * 4);
        }
        bVar4 = bsp_pid();
        prVar7 = new_request(local_94);
        prVar7->kind = PUT;
        (prVar7->payload).put.src_addr = local_60;
        (prVar7->payload).put.dst_addr = tmp_space;
        (prVar7->payload).put.src_pid = bVar4;
        (prVar7->payload).put.dst_pid = bVar1;
        (prVar7->payload).put.size = size;
        (prVar7->payload).put.offset = 0;
      }
      prVar7 = new_request(local_94);
      prVar7->kind = EXEC;
      (prVar7->payload).exec.func = reducer;
      (prVar7->payload).put.dst_addr = pvVar5;
      (prVar7->payload).exec.a0 = zero;
      (prVar7->payload).exec.xs = tmp_space;
      (prVar7->payload).exec.size = iVar10 * size;
      local_94 = local_94 + 1;
      iVar12 = iVar12 * q;
    } while (iVar12 < iVar2);
    if (0 < iVar10) {
      zero = (void *)((long)pvVar5 + (long)((iVar10 + -1) * size));
    }
  }
  bVar1 = bsp_pid();
  bVar4 = bsp_pid();
  prVar7 = new_request(local_94);
  prVar7->kind = PUT;
  (prVar7->payload).put.src_addr = zero;
  (prVar7->payload).put.dst_addr = tmp_space;
  (prVar7->payload).put.src_pid = bVar4;
  (prVar7->payload).put.dst_pid = bVar1;
  (prVar7->payload).put.size = size;
  (prVar7->payload).put.offset = 0;
  prVar7 = new_request(local_94);
  prVar7->kind = EXEC;
  (prVar7->payload).exec.func = reducer;
  (prVar7->payload).put.dst_addr = dst;
  (prVar7->payload).exec.a0 = tmp_space;
  (prVar7->payload).exec.xs = src;
  (prVar7->payload).exec.size = size * nmemb;
  return local_94 + 1;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_scan_qtree_single( bsc_step_t depends, 
        bsc_group_t group, const void * src, void * dst, void * tmp_space, 
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size,
        int q )
{
    const group_t * g = group;
    bsc_pid_t i, j, k=0, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, s = g?g->lid[bsp_pid()]:bsp_pid();
    char * dst_bytes = dst;
    char * tmp1 = tmp_space;
    char * tmp2 = tmp1 + P * size;
    const void * prefix;

    (*reducer)( dst, zero, src, size * nmemb );

    for (range = 1; range < P; range *= q ) {
        const bsc_size_t shift = (range==1);
        const void * last = NULL;
        if (range == 1)
            last = (nmemb==0 ? zero : &dst_bytes[(nmemb-1)*size]);
        else
            last = (k==0 ? zero : &tmp2[(k-1)*size]);

        for ( i = 1; i < q; ++i ) {
            j = s + range * i + shift;
            if ( j < P ) {
                bsc_put( depends, g?g->gid[j]:j, last, tmp1, i * size, size);
            }
        }
    
        /* k is number of received elements */
        k = MIN( q, (range+s-shift)/range);

        if (s < P - shift) {
            j = g?g->gid[s+shift]:s+shift;
            bsc_put(depends, j, last, tmp1, 0, size);
        }
        bsc_exec_reduce( depends, reducer, tmp2, zero, tmp1, size*k );
        depends += 1;
    }

    prefix = k > 0 ? &tmp2[(k-1)*size] : zero ;
    bsc_put(depends, bsp_pid(), prefix, tmp1, 0, size);

    bsc_exec_reduce( depends, reducer, dst, tmp1, src, size*nmemb );
    return depends+1;
}